

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

void ps_lattice_pushq(ps_lattice_t *dag,ps_latlink_t *link)

{
  latlink_list_t *plVar1;
  latlink_list_s *plVar2;
  latlink_list_t **pplVar3;
  latlink_list_t **pplVar4;
  
  plVar1 = dag->q_head;
  plVar2 = (latlink_list_s *)
           __listelem_malloc__(dag->latlink_list_alloc,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                               ,0x417);
  pplVar4 = &dag->q_tail;
  plVar2->link = link;
  plVar2->next = (latlink_list_s *)0x0;
  if (plVar1 == (latlink_list_t *)0x0) {
    pplVar3 = &dag->q_head;
  }
  else {
    pplVar3 = pplVar4;
    pplVar4 = &(*pplVar4)->next;
  }
  *pplVar4 = plVar2;
  *pplVar3 = plVar2;
  return;
}

Assistant:

void
ps_lattice_pushq(ps_lattice_t *dag, ps_latlink_t *link)
{
    if (dag->q_head == NULL)
        dag->q_head = dag->q_tail = latlink_list_new(dag, link, NULL);
    else {
        dag->q_tail->next = latlink_list_new(dag, link, NULL);
        dag->q_tail = dag->q_tail->next;
    }

}